

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O1

void __thiscall QDirPrivate::QDirPrivate(QDirPrivate *this,QDirPrivate *copy)

{
  QFileSystemEntry *this_00;
  Data *pDVar1;
  Data *pDVar2;
  Data *pDVar3;
  qint64 qVar4;
  qint64 qVar5;
  qint64 qVar6;
  qint64 qVar7;
  qint64 qVar8;
  qint16 qVar9;
  MetaDataFlags MVar10;
  uint uVar11;
  
  (this->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  pDVar1 = (copy->nameFilters).d.d;
  (this->nameFilters).d.d = pDVar1;
  (this->nameFilters).d.ptr = (copy->nameFilters).d.ptr;
  (this->nameFilters).d.size = (copy->nameFilters).d.size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (this->sort).super_QFlagsStorageHelper<QDir::SortFlag,_4>.super_QFlagsStorage<QDir::SortFlag>.i =
       (copy->sort).super_QFlagsStorageHelper<QDir::SortFlag,_4>.super_QFlagsStorage<QDir::SortFlag>
       .i;
  (this->filters).super_QFlagsStorageHelper<QDir::Filter,_4>.super_QFlagsStorage<QDir::Filter>.i =
       (copy->filters).super_QFlagsStorageHelper<QDir::Filter,_4>.super_QFlagsStorage<QDir::Filter>.
       i;
  (this->fileEngine)._M_t.
  super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
  super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
  super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl = (QAbstractFileEngine *)0x0;
  pDVar2 = (copy->dirEntry).m_filePath.d.d;
  (this->dirEntry).m_filePath.d.d = pDVar2;
  (this->dirEntry).m_filePath.d.ptr = (copy->dirEntry).m_filePath.d.ptr;
  (this->dirEntry).m_filePath.d.size = (copy->dirEntry).m_filePath.d.size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  pDVar3 = (copy->dirEntry).m_nativeFilePath.d.d;
  (this->dirEntry).m_nativeFilePath.d.d = pDVar3;
  (this->dirEntry).m_nativeFilePath.d.ptr = (copy->dirEntry).m_nativeFilePath.d.ptr;
  (this->dirEntry).m_nativeFilePath.d.size = (copy->dirEntry).m_nativeFilePath.d.size;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (this->dirEntry).m_lastDotInFileName = (copy->dirEntry).m_lastDotInFileName;
  qVar9 = (copy->dirEntry).m_firstDotInFileName;
  (this->dirEntry).m_lastSeparator = (copy->dirEntry).m_lastSeparator;
  (this->dirEntry).m_firstDotInFileName = qVar9;
  this_00 = &(this->fileCache).absoluteDirEntry;
  (this->fileCache).files.d.d = (Data *)0x0;
  (this->fileCache).files.d.ptr = (QString *)0x0;
  (this->fileCache).files.d.size = 0;
  (this->fileCache).fileInfos.d.d = (Data *)0x0;
  (this->fileCache).fileInfos.d.ptr = (QFileInfo *)0x0;
  (this->fileCache).fileInfos.d.size = 0;
  (this->fileCache).fileListsInitialized._M_base._M_i = false;
  QFileSystemEntry::QFileSystemEntry(this_00);
  (this->fileCache).metaData.knownFlagsMask =
       (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)0x0;
  (this->fileCache).metaData.entryFlags =
       (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)0x0;
  (this->fileCache).metaData.size_ = -1;
  (this->fileCache).metaData.accessTime_ = 0;
  (this->fileCache).metaData.birthTime_ = 0;
  (this->fileCache).metaData.metadataChangeTime_ = 0;
  (this->fileCache).metaData.modificationTime_ = 0;
  (this->fileCache).metaData.userId_ = 0xfffffffe;
  (this->fileCache).metaData.groupId_ = 0xfffffffe;
  LOCK();
  (this->fileCache).fileListsInitialized._M_base._M_i =
       (__int_type_conflict)((copy->fileCache).fileListsInitialized._M_base._M_i & 1);
  UNLOCK();
  QArrayDataPointer<QString>::operator=(&(this->fileCache).files.d,&(copy->fileCache).files.d);
  QArrayDataPointer<QFileInfo>::operator=
            (&(this->fileCache).fileInfos.d,&(copy->fileCache).fileInfos.d);
  QString::operator=(&this_00->m_filePath,&(copy->fileCache).absoluteDirEntry.m_filePath);
  QByteArray::operator=
            (&(this->fileCache).absoluteDirEntry.m_nativeFilePath,
             &(copy->fileCache).absoluteDirEntry.m_nativeFilePath);
  qVar9 = (copy->fileCache).absoluteDirEntry.m_firstDotInFileName;
  (this->fileCache).absoluteDirEntry.m_lastSeparator =
       (copy->fileCache).absoluteDirEntry.m_lastSeparator;
  (this->fileCache).absoluteDirEntry.m_firstDotInFileName = qVar9;
  (this->fileCache).absoluteDirEntry.m_lastDotInFileName =
       (copy->fileCache).absoluteDirEntry.m_lastDotInFileName;
  MVar10.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
  super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
       (copy->fileCache).metaData.entryFlags.
       super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>;
  qVar4 = (copy->fileCache).metaData.size_;
  qVar5 = (copy->fileCache).metaData.accessTime_;
  qVar6 = (copy->fileCache).metaData.birthTime_;
  qVar7 = (copy->fileCache).metaData.metadataChangeTime_;
  qVar8 = (copy->fileCache).metaData.modificationTime_;
  (this->fileCache).metaData.knownFlagsMask =
       (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)
       (copy->fileCache).metaData.knownFlagsMask.
       super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>;
  (this->fileCache).metaData.entryFlags =
       (MetaDataFlags)
       MVar10.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
       super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i;
  (this->fileCache).metaData.size_ = qVar4;
  (this->fileCache).metaData.accessTime_ = qVar5;
  (this->fileCache).metaData.birthTime_ = qVar6;
  (this->fileCache).metaData.metadataChangeTime_ = qVar7;
  (this->fileCache).metaData.modificationTime_ = qVar8;
  uVar11 = (copy->fileCache).metaData.groupId_;
  (this->fileCache).metaData.userId_ = (copy->fileCache).metaData.userId_;
  (this->fileCache).metaData.groupId_ = uVar11;
  return;
}

Assistant:

QDirPrivate::QDirPrivate(const QDirPrivate &copy)
    : QSharedData(copy),
      // mutex is not copied
      nameFilters(copy.nameFilters),
      sort(copy.sort),
      filters(copy.filters),
      // fileEngine is not copied
      dirEntry(copy.dirEntry)
{
    QMutexLocker locker(&copy.fileCache.mutex);
    fileCache.fileListsInitialized = copy.fileCache.fileListsInitialized.load();
    fileCache.files = copy.fileCache.files;
    fileCache.fileInfos = copy.fileCache.fileInfos;
    fileCache.absoluteDirEntry = copy.fileCache.absoluteDirEntry;
    fileCache.metaData = copy.fileCache.metaData;
}